

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArrayIndexEnumeratorBase.cpp
# Opt level: O0

void __thiscall
Js::JavascriptArrayIndexEnumeratorBase::JavascriptArrayIndexEnumeratorBase
          (JavascriptArrayIndexEnumeratorBase *this,JavascriptArray *arrayObject,
          EnumeratorFlags flags,ScriptContext *scriptContext)

{
  ScriptContext *scriptContext_local;
  EnumeratorFlags flags_local;
  JavascriptArray *arrayObject_local;
  JavascriptArrayIndexEnumeratorBase *this_local;
  
  JavascriptEnumerator::JavascriptEnumerator(&this->super_JavascriptEnumerator,scriptContext);
  (this->super_JavascriptEnumerator).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e02d30;
  Memory::WriteBarrierPtr<Js::JavascriptArray>::WriteBarrierPtr(&this->arrayObject,arrayObject);
  this->flags = flags;
  return;
}

Assistant:

JavascriptArrayIndexEnumeratorBase::JavascriptArrayIndexEnumeratorBase(
        JavascriptArray* arrayObject, EnumeratorFlags flags, ScriptContext* scriptContext) :
        JavascriptEnumerator(scriptContext),
        arrayObject(arrayObject),
        flags(flags)
    {
    }